

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O0

void RemoveExistingObjectFromDictionary(JlDataObject *DictionaryObject,char *KeyName)

{
  JlDataObject *local_28;
  JlDataObject *object;
  char *pcStack_18;
  JL_STATUS jlStatus;
  char *KeyName_local;
  JlDataObject *DictionaryObject_local;
  
  local_28 = (JlDataObject *)0x0;
  pcStack_18 = KeyName;
  KeyName_local = (char *)DictionaryObject;
  object._4_4_ = JlGetObjectFromDictionaryByKey(DictionaryObject,KeyName,&local_28);
  if ((object._4_4_ == JL_STATUS_SUCCESS) &&
     (object._4_4_ = JlDetachObjectFromDictionaryObject((JlDataObject *)KeyName_local,pcStack_18),
     object._4_4_ == JL_STATUS_SUCCESS)) {
    JlFreeObjectTree(&local_28);
  }
  return;
}

Assistant:

static
void
    RemoveExistingObjectFromDictionary
    (
        JlDataObject*               DictionaryObject,
        char const*                 KeyName
    )
{
    JL_STATUS jlStatus;
    JlDataObject* object = NULL;

    jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        jlStatus = JlDetachObjectFromDictionaryObject( DictionaryObject, KeyName );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlFreeObjectTree( &object );
        }
        else
        {
            jlStatus = JL_STATUS_INTERNAL_ERROR;
        }
    }
}